

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlsxio_read.c
# Opt level: O2

void data_sheet_expat_callback_find_value_start(void *callbackdata,XML_Char *name,XML_Char **atts)

{
  int iVar1;
  char *pcVar2;
  code *pcVar3;
  undefined8 uVar4;
  
  iVar1 = XML_Char_icmp_ins(name,"v");
  if ((iVar1 == 0) || (iVar1 = XML_Char_icmp_ins(name,"t"), iVar1 == 0)) {
    XML_SetElementHandler(*callbackdata,0,data_sheet_expat_callback_find_value_end);
    uVar4 = *callbackdata;
    pcVar3 = data_sheet_expat_callback_value_data;
  }
  else {
    iVar1 = XML_Char_icmp_ins(name,"is");
    if (iVar1 == 0) {
      *(undefined4 *)((long)callbackdata + 0x40) = 2;
      return;
    }
    iVar1 = XML_Char_icmp_ins(name,"rPh");
    if (iVar1 != 0) {
      return;
    }
    pcVar2 = strdup(name);
    *(char **)((long)callbackdata + 0x48) = pcVar2;
    *(undefined8 *)((long)callbackdata + 0x50) = 1;
    *(code **)((long)callbackdata + 0x58) = data_sheet_expat_callback_find_value_start;
    *(code **)((long)callbackdata + 0x60) = data_sheet_expat_callback_find_cell_end;
    *(undefined8 *)((long)callbackdata + 0x68) = 0;
    XML_SetElementHandler
              (*callbackdata,data_sheet_expat_callback_skip_tag_start,
               data_sheet_expat_callback_skip_tag_end);
    uVar4 = *callbackdata;
    pcVar3 = (code *)0x0;
  }
  XML_SetCharacterDataHandler(uVar4,pcVar3);
  return;
}

Assistant:

void data_sheet_expat_callback_find_value_start (void* callbackdata, const XML_Char* name, const XML_Char** atts)
{
  struct data_sheet_callback_data* data = (struct data_sheet_callback_data*)callbackdata;
  if (XML_Char_icmp_ins(name, X("v")) == 0 || XML_Char_icmp_ins(name, X("t")) == 0) {
    XML_SetElementHandler(data->xmlparser, NULL, data_sheet_expat_callback_find_value_end);
    XML_SetCharacterDataHandler(data->xmlparser, data_sheet_expat_callback_value_data);
  } else if (XML_Char_icmp_ins(name, X("is")) == 0) {
    data->cell_string_type = inline_string;
  } else if (XML_Char_icmp_ins(name, X("rPh")) == 0) {
    data->skiptag = XML_Char_dup(name);
    data->skiptagcount = 1;
    data->skip_start = data_sheet_expat_callback_find_value_start;
    data->skip_end = data_sheet_expat_callback_find_cell_end;
    data->skip_data = NULL;
    XML_SetElementHandler(data->xmlparser, data_sheet_expat_callback_skip_tag_start, data_sheet_expat_callback_skip_tag_end);
    XML_SetCharacterDataHandler(data->xmlparser, NULL);
  }
}